

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

int SoapySDRDevice_setClockSource(SoapySDRDevice *device,char *source)

{
  undefined1 *puVar1;
  allocator local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0013ef28);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_40,source,&local_41);
  (**(code **)(*(long *)device + 0x240))(device,local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return 0;
}

Assistant:

int SoapySDRDevice_setClockSource(SoapySDRDevice *device, const char *source)
{
    __SOAPY_SDR_C_TRY
    device->setClockSource(source);
    __SOAPY_SDR_C_CATCH
}